

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void speak_pa_finished(void *userData)

{
  if (userData != (void *)0x0) {
    if ((*userData != (void *)0x0) && (*(char *)((long)userData + 0x21) == '\0')) {
      free(*userData);
      *(undefined8 *)userData = 0;
    }
    Pa_CloseStream(*(undefined8 *)((long)userData + 0x30));
    *(undefined1 *)((long)userData + 0x22) = 0;
    if (*(char *)((long)userData + 0x21) == '\x01') {
      *(undefined1 *)((long)userData + 0x23) = 1;
    }
    else {
      *(undefined1 *)((long)userData + 0x24) = 1;
    }
    if (g_verbose == true) {
      speak_pa_finished_cold_1();
    }
    if ((*(code **)((long)userData + 0x28) != (code *)0x0) &&
       (*(char *)((long)userData + 0x23) == '\0')) {
      (**(code **)((long)userData + 0x28))();
      return;
    }
  }
  return;
}

Assistant:

static void speak_pa_finished(void *userData)
{
	SpeakData *data = (SpeakData *)userData;
	if (data == NULL)
	{
		return;
	}

	if (data->data != NULL && !data->pause)
	{
		free(data->data);
		data->data = NULL;
	}

	Pa_CloseStream(data->stream);
	data->speaking = false;

	if (data->pause)
	{
		data->paused = true;
	}
	else
	{
		data->finished = true;
	}

	if (g_verbose)
	{
		if (data->paused)
		{
			console_message(u8"非同期発声一時停止\n");
		}
		else
		{
			console_message(u8"非同期発声完了\n");
		}
	}

	if (data->onFinished != NULL && !data->paused)
	{
		(data->onFinished)();
	}
}